

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

void __thiscall lsh::table::erase(table *this,vector *v)

{
  _Hash_node_base *__src;
  uint uVar1;
  bool bVar2;
  uint in_EAX;
  uint uVar3;
  _Hash_node_base *p_Var4;
  invalid_argument *this_00;
  size_t __n;
  _Hash_node_base *__dest;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  __node_base *p_Var7;
  ulong uVar8;
  uint u;
  undefined8 uStack_38;
  
  uVar1 = this->dimensions_;
  uStack_38._0_4_ = in_EAX;
  uVar3 = vector::size(v);
  if (uVar1 != uVar3) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar5 = ((long)(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->partitions_).
                 super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  uStack_38 = (ulong)(uint)uStack_38;
  p_Var7 = &(this->vectors_)._M_h._M_before_begin;
  do {
    p_Var7 = p_Var7->_M_nxt;
    if (p_Var7 == (__node_base *)0x0) goto LAB_00131735;
    bVar2 = vector::operator==((vector *)(p_Var7 + 2),v);
  } while (!bVar2);
  uStack_38 = CONCAT44((int)*(size_type *)(p_Var7 + 1),(uint)uStack_38);
LAB_00131735:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsh::vector>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->vectors_)._M_h,(long)&uStack_38 + 4);
  if ((int)uVar5 != 0) {
    uVar8 = 0;
    do {
      for (p_Var6 = (this->partitions_).
                    super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_h._M_before_begin._M_nxt;
          p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
        __dest = p_Var6[2]._M_nxt;
        p_Var4 = p_Var6[3]._M_nxt;
        if (__dest != p_Var4) {
          __n = (long)p_Var4 - (long)__dest;
          do {
            __n = __n - 4;
            if (*(int *)&__dest->_M_nxt == uStack_38._4_4_) {
              __src = (_Hash_node_base *)((long)&__dest->_M_nxt + 4);
              if (__src != p_Var4) {
                memmove(__dest,__src,__n);
                p_Var4 = p_Var6[3]._M_nxt;
              }
              p_Var6[3]._M_nxt = (_Hash_node_base *)((long)&p_Var4[-1]._M_nxt + 4);
              break;
            }
            __dest = (_Hash_node_base *)((long)&__dest->_M_nxt + 4);
          } while (__dest != p_Var4);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar5 & 0xffffffff));
  }
  return;
}

Assistant:

void table::erase(const vector& v) {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();
    unsigned int u = 0;

    for (const auto& it: this->vectors_) {
      if (it.second == v) {
        u = it.first;
        break;
      }
    }

    this->vectors_.erase(u);

    for (unsigned int i = 0; i < n; i++) {
      partition& p = this->partitions_[i];

      for (auto& it: p) {
        bucket& b = it.second;

        for (auto j = b.begin(); j != b.end(); j++) {
          if (*j == u) {
            b.erase(j);
            break;
          }
        }
      }
    }
  }